

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block-utils.h
# Opt level: O0

Expression *
wasm::BlockUtils::simplifyToContents<wasm::Vacuum>(Block *block,Vacuum *parent,bool allowTypeChange)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  PassOptions *passOptions;
  Module *pMVar4;
  Expression *pEVar5;
  Name target;
  bool local_1f1;
  BasicType local_1dc;
  uintptr_t local_1d8;
  uintptr_t local_1d0;
  Builder local_1c8 [3];
  EffectAnalyzer local_1b0;
  undefined1 local_49;
  Expression *pEStack_48;
  bool sideEffects;
  Expression *singleton;
  size_t local_38;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_30;
  ExpressionList *list;
  Pass *pPStack_20;
  bool allowTypeChange_local;
  Vacuum *parent_local;
  Block *block_local;
  
  local_30 = &(block->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
  list._7_1_ = allowTypeChange;
  pPStack_20 = (Pass *)parent;
  parent_local = (Vacuum *)block;
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(local_30);
  if (sVar2 == 1) {
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (local_30,0);
    singleton = *(Expression **)
                 &(parent_local->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                  ).super_Pass.name;
    local_38 = (parent_local->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_Pass.name._M_string_length;
    target.super_IString.str._M_str = (char *)singleton;
    target.super_IString.str._M_len = local_38;
    bVar1 = BranchUtils::BranchSeeker::has((BranchSeeker *)*ppEVar3,singleton,target);
    if (!bVar1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (local_30,0);
      pEStack_48 = *ppEVar3;
      passOptions = Pass::getPassOptions(pPStack_20);
      pMVar4 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                         ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                          (pPStack_20 + 1));
      EffectAnalyzer::EffectAnalyzer(&local_1b0,passOptions,pMVar4,pEStack_48);
      bVar1 = EffectAnalyzer::hasSideEffects(&local_1b0);
      EffectAnalyzer::~EffectAnalyzer(&local_1b0);
      local_49 = bVar1;
      if ((!bVar1) && (bVar1 = wasm::Type::isConcrete(&pEStack_48->type), !bVar1)) {
        pMVar4 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                           ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                            (pPStack_20 + 1));
        Builder::Builder(local_1c8,pMVar4);
        pEVar5 = Builder::replaceWithIdenticalType<wasm::Block>(local_1c8,(Block *)parent_local);
        return pEVar5;
      }
      local_1d0 = (pEStack_48->type).id;
      local_1d8 = (uintptr_t)
                  (parent_local->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                  ).super_Pass.runner;
      bVar1 = wasm::Type::isSubType((Type)local_1d0,(Type)local_1d8);
      if ((!bVar1) && ((list._7_1_ & 1) == 0)) {
        bVar1 = wasm::Type::isConcrete
                          ((Type *)&(parent_local->
                                    super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                    ).super_Pass.runner);
        local_1f1 = false;
        if (bVar1) {
          local_1dc = unreachable;
          local_1f1 = wasm::Type::operator==(&pEStack_48->type,&local_1dc);
        }
        if (local_1f1 != false) {
          return (Expression *)parent_local;
        }
        __assert_fail("block->type.isConcrete() && singleton->type == Type::unreachable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/block-utils.h"
                      ,0x36,
                      "Expression *wasm::BlockUtils::simplifyToContents(Block *, T *, bool) [T = wasm::Vacuum]"
                     );
      }
      return pEStack_48;
    }
  }
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(local_30);
  if (sVar2 == 0) {
    ExpressionManipulator::nop<wasm::Block>((Block *)parent_local);
  }
  return (Expression *)parent_local;
}

Assistant:

inline Expression*
simplifyToContents(Block* block, T* parent, bool allowTypeChange = false) {
  auto& list = block->list;
  if (list.size() == 1 &&
      !BranchUtils::BranchSeeker::has(list[0], block->name)) {
    // just one element. try to replace the block
    auto* singleton = list[0];
    auto sideEffects =
      EffectAnalyzer(parent->getPassOptions(), *parent->getModule(), singleton)
        .hasSideEffects();
    if (!sideEffects && !singleton->type.isConcrete()) {
      // no side effects, and singleton is not returning a value, so we can
      // throw away the block and its contents, basically
      return Builder(*parent->getModule()).replaceWithIdenticalType(block);
    } else if (Type::isSubType(singleton->type, block->type) ||
               allowTypeChange) {
      return singleton;
    } else {
      // (side effects +) type change, must be block with declared value but
      // inside is unreachable (if both concrete, must match, and since no name
      // on block, we can't be branched to, so if singleton is unreachable, so
      // is the block)
      assert(block->type.isConcrete() && singleton->type == Type::unreachable);
      // we could replace with unreachable, but would need to update all
      // the parent's types
    }
  } else if (list.size() == 0) {
    ExpressionManipulator::nop(block);
  }
  return block;
}